

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int breada(bstring b,bNread readPtr,void *parm)

{
  int iVar1;
  size_t sVar2;
  int local_38;
  int local_34;
  int n;
  int l;
  int i;
  void *parm_local;
  bNread readPtr_local;
  bstring b_local;
  
  if ((((b != (bstring)0x0) && (0 < b->mlen)) && (-1 < b->slen)) &&
     (((b->slen <= b->mlen && (0 < b->mlen)) && (readPtr != (bNread)0x0)))) {
    n = b->slen;
    local_34 = n + 0x10;
    while (iVar1 = balloc(b,local_34 + 1), iVar1 == 0) {
      sVar2 = (*readPtr)(b->data + n,1,(long)(local_34 - n),parm);
      n = (int)sVar2 + n;
      b->slen = n;
      if (n < local_34) {
        b->data[n] = '\0';
        return 0;
      }
      if (local_34 < 0x400) {
        local_38 = local_34;
      }
      else {
        local_38 = 0x400;
      }
      local_34 = local_38 + local_34;
    }
  }
  return -1;
}

Assistant:

int breada (bstring b, bNread readPtr, void * parm) {
int i, l, n;

	if (b == NULL || b->mlen <= 0 || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || readPtr == NULL) return BSTR_ERR;

	i = b->slen;
	for (n=i+16; ; n += ((n < BS_BUFF_SZ) ? n : BS_BUFF_SZ)) {
		if (BSTR_OK != balloc (b, n + 1)) return BSTR_ERR;
		l = (int) readPtr ((void *) (b->data + i), 1, n - i, parm);
		i += l;
		b->slen = i;
		if (i < n) break;
	}

	b->data[i] = (unsigned char) '\0';
	return 0;
}